

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::TypedConfigurations
          (TypedConfigurations *this,Configurations *configurations,
          LogStreamsReferenceMap *logStreamsReference)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Configurations *in_stack_00000338;
  TypedConfigurations *in_stack_00000340;
  
  threading::ThreadSafe::ThreadSafe((ThreadSafe *)0x26c81b);
  *in_RDI = &PTR_acquireLock_002d4498;
  utils::std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       *)0x26c838);
  utils::std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       *)0x26c84b);
  utils::std::
  map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x26c85e);
  utils::std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       *)0x26c874);
  utils::std::
  map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  ::map((map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
         *)0x26c88a);
  utils::std::
  map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
  ::map((map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
         *)0x26c8a0);
  utils::std::
  map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>::
  map((map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
       *)0x26c8b6);
  utils::std::
  map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
  ::map((map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
         *)0x26c8cc);
  utils::std::
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::map((map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         *)0x26c8e2);
  utils::std::
  map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
  ::map((map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
         *)0x26c8f8);
  in_RDI[2] = in_RSI;
  in_RDI[0x3f] = in_RDX;
  build(in_stack_00000340,in_stack_00000338);
  return;
}

Assistant:

TypedConfigurations::TypedConfigurations(Configurations* configurations,
    base::LogStreamsReferenceMap* logStreamsReference) {
  m_configurations = configurations;
  m_logStreamsReference = logStreamsReference;
  build(m_configurations);
}